

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void http_file_free(void *arg)

{
  http_file *hf;
  void *arg_local;
  
  if (arg != (void *)0x0) {
    nni_strfree(*(char **)((long)arg + 8));
    nni_strfree(*(char **)((long)arg + 0x10));
    nni_strfree(*arg);
    nni_free(arg,0x18);
  }
  return;
}

Assistant:

static void
http_file_free(void *arg)
{
	http_file *hf;
	if ((hf = arg) != NULL) {
		nni_strfree(hf->path);
		nni_strfree(hf->ctype);
		nni_strfree(hf->base);
		NNI_FREE_STRUCT(hf);
	}
}